

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table.cc
# Opt level: O0

void ** __thiscall tcmalloc::StackTraceTable::ReadStackTracesAndClear(StackTraceTable *this)

{
  Entry *pEVar1;
  _func_StackTrace_ptr_void_ptr_ptr *next_fn;
  SpinLock *l;
  pointer ppvVar2;
  Entry *next;
  Entry *entry;
  SpinLockHolder local_28;
  SpinLockHolder h;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> local_18;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> out;
  StackTraceTable *this_local;
  
  out._M_t.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
  super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
  super__Head_base<0UL,_void_**,_false>._M_head_impl =
       (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)
       (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)this;
  next_fn = ReadStackTracesAndClear()::$_0::operator_cast_to_function_pointer
                      ((__0 *)((long)&h.lock_ + 7));
  ProduceStackTracesDump((tcmalloc *)&local_18,next_fn,this->head_);
  this->error_ = false;
  l = Static::pageheap_lock();
  SpinLockHolder::SpinLockHolder(&local_28,l);
  next = this->head_;
  while (next != (Entry *)0x0) {
    pEVar1 = next->next;
    STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::deallocate
              ((STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void> *)&this->field_0x10,
               next,1);
    next = pEVar1;
  }
  this->head_ = (Entry *)0x0;
  ppvVar2 = std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::release(&local_18);
  SpinLockHolder::~SpinLockHolder(&local_28);
  std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::~unique_ptr(&local_18);
  return ppvVar2;
}

Assistant:

void** StackTraceTable::ReadStackTracesAndClear() {
  std::unique_ptr<void*[]> out = ProduceStackTracesDump(
    +[] (const void** current_head) -> const StackTrace* {
      const Entry* head = static_cast<const Entry*>(*current_head);
      *current_head = head->next;
      return &head->trace;
    }, head_);

  // Clear state
  error_ = false;

  SpinLockHolder h(Static::pageheap_lock());
  Entry* entry = head_;
  while (entry != nullptr) {
    Entry* next = entry->next;
    allocator_.deallocate(entry, 1);
    entry = next;
  }
  head_ = nullptr;

  return out.release();
}